

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPFSP.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint seed;
  int iVar2;
  long lVar3;
  long lVar4;
  long __val;
  ostream *poVar5;
  unsigned_short nIndividui;
  char *pcVar6;
  unsigned_short i;
  ushort scalaElaborazione;
  ulong uVar7;
  bool normalizzazione;
  double local_358;
  double local_350;
  size_t pos;
  Permutazione migliorIndividuo;
  ADE_DEP_DPFSP adeDep;
  string percorsoFile;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string nomeReport;
  string percorso;
  string local_250;
  ofstream file;
  
  percorsoFile._M_dataplus._M_p = (pointer)&percorsoFile.field_2;
  percorsoFile._M_string_length = 0;
  percorsoFile.field_2._M_local_buf[0] = '\0';
  scalaElaborazione = 100;
  local_350 = 0.0;
  local_358 = 1.2;
  seed = 0;
  switch(argc) {
  case 1:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Devi inserire il percorso del file!");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(-1);
  case 2:
    nIndividui = 0x32;
    normalizzazione = false;
    goto LAB_00102717;
  case 3:
    normalizzazione = false;
    scalaElaborazione = 100;
    goto LAB_001026dd;
  case 4:
    normalizzazione = false;
    goto LAB_001026a2;
  case 5:
    normalizzazione = false;
    goto LAB_00102691;
  case 6:
    normalizzazione = false;
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,argv[7],(allocator<char> *)&adeDep);
    seed = std::__cxx11::stoi((string *)&file,&pos,10);
    std::__cxx11::string::~string((string *)&file);
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,argv[6],(allocator<char> *)&adeDep);
    iVar2 = std::__cxx11::stoi((string *)&file,&pos,10);
    normalizzazione = iVar2 != 0;
    std::__cxx11::string::~string((string *)&file);
  }
  local_358 = strtod(argv[5],(char **)0x0);
LAB_00102691:
  local_350 = strtod(argv[4],(char **)0x0);
LAB_001026a2:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,argv[3],(allocator<char> *)&adeDep);
  iVar2 = std::__cxx11::stoi((string *)&file,&pos,10);
  std::__cxx11::string::~string((string *)&file);
  scalaElaborazione = (ushort)iVar2;
LAB_001026dd:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,argv[2],(allocator<char> *)&adeDep);
  iVar2 = std::__cxx11::stoi((string *)&file,&pos,10);
  nIndividui = (unsigned_short)iVar2;
  std::__cxx11::string::~string((string *)&file);
LAB_00102717:
  std::__cxx11::string::assign((char *)&percorsoFile);
  lVar3 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&local_250,(string *)&percorsoFile);
  ADE_DEP_DPFSP::ADE_DEP_DPFSP(&adeDep,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  ADE_DEP_DPFSP::esegui
            (&migliorIndividuo,&adeDep,nIndividui,scalaElaborazione,local_350,0.1,local_358,
             normalizzazione,seed);
  lVar4 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::find_last_of((char *)&percorsoFile,0x108060);
  std::__cxx11::string::substr((ulong)&percorso,(ulong)&percorsoFile);
  std::operator+(&local_2b0,&percorso,"_report-");
  __val = std::chrono::_V2::system_clock::now();
  std::__cxx11::to_string(&local_2d0,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &local_2b0,&local_2d0);
  std::operator+(&nomeReport,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,".csv");
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::ofstream::ofstream(&file,(string *)&nomeReport,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar5 = std::operator<<((ostream *)&file,
                             "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&file,adeDep.istanza.fabbriche);
    std::operator<<(poVar5,";");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&file,adeDep.istanza.lavori);
    std::operator<<(poVar5,";");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&file,adeDep.istanza.macchine);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
    std::operator<<(poVar5,";");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&file,scalaElaborazione);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<double>(local_350);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<double>(local_358);
    std::operator<<(poVar5,";");
    pcVar6 = "No";
    if (normalizzazione != false) {
      pcVar6 = "Si";
    }
    poVar5 = std::operator<<((ostream *)&file,pcVar6);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
    std::operator<<(poVar5,";");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
    std::operator<<(poVar5,";");
    for (uVar7 = 0; uVar7 < migliorIndividuo.dimensione; uVar7 = uVar7 + 1) {
      std::ostream::operator<<((ostream *)&file,migliorIndividuo.individuo[uVar7]);
      if ((int)uVar7 != migliorIndividuo.dimensione - 1) {
        std::operator<<((ostream *)&file,",");
      }
    }
    poVar5 = std::operator<<((ostream *)&file,";");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&file);
  std::__cxx11::string::~string((string *)&nomeReport);
  std::__cxx11::string::~string((string *)&percorso);
  Permutazione::~Permutazione(&migliorIndividuo);
  ADE_DEP_DPFSP::~ADE_DEP_DPFSP(&adeDep);
  std::__cxx11::string::~string((string *)&percorsoFile);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	unsigned int seed = 0;
	unsigned short scalaElaborazione = 100;
	unsigned int nIndividui = 50;
	double theta = 0;
	double Fmax = 1.2;
	bool normalizzazione = false;
	string percorsoFile;

	size_t pos;

	switch (argc) {
		default:
		case 8:
			seed = stoi(argv[7], &pos);
		case 7:
			normalizzazione = stoi(argv[6], &pos);
		case 6:
			Fmax = strtod(argv[5], NULL);
		case 5:
			theta = strtod(argv[4], NULL);
		case 4:
			scalaElaborazione = stoi(argv[3], &pos);
		case 3:
			nIndividui = stoi(argv[2], &pos);
		case 2:
			percorsoFile = argv[1];
			break;
		case 1:
			cerr << "Devi inserire il percorso del file!" << endl << endl;
			exit(-1);
	}

	/*
	cout << endl << endl;
	cout << "Il programma sara' eseguito con queste impostazioni:" << endl << endl;
	cout << "Percorso file: " << percorsoFile << endl;
	cout << "Numero individui: " << nIndividui << endl;
	cout << "Scala elaborazione: " << scalaElaborazione << endl;
	cout << "Theta: " << theta << endl;
	cout << "F massimo: " << Fmax << endl;
	cout << "Normalizzazione attiva: " << (normalizzazione ? "Si" : "No") << endl;

	if(seed > 0) cout << "Seed: " << seed << endl;
	else cout << "Seed: " << "Random" << endl << endl;
	*/

	using orologio = std::chrono::system_clock;
	using sec = std::chrono::duration<double>;

	const auto tempoIniziale = orologio::now();


	//percorsoFile = "C:/users/edu4r/Desktop/DPFSP_Large/5/Ta016_5.txt";

	ADE_DEP_DPFSP adeDep(percorsoFile);
	Permutazione migliorIndividuo = adeDep.esegui(nIndividui, scalaElaborazione, theta, 0.1, Fmax, 
		normalizzazione, seed);

	const sec durata = orologio::now() - tempoIniziale;

	//Stampo a video le informazioni

	/*
	cout << "Risultati: " << endl << endl;
	cout << "Tempo speso: " << durata.count() << " secondi" << endl;
	cout << "Individuo: ";
	migliorIndividuo.stampa();
	cout << "Punteggio: " << migliorIndividuo.score << endl << endl;
	
	exit(0);
	*/
	

	//Salvo le informazioni su un CSV

	int posizione = percorsoFile.find_last_of(".");
	string percorso = percorsoFile.substr(0, posizione);

	string nomeReport = percorso + "_report-" + to_string(orologio::now().time_since_epoch().count()) + ".csv";

	ofstream file(nomeReport);
	
	if (file.is_open()) {
		file << "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;" << endl;

		file << adeDep.istanza.fabbriche << ";";
		file << adeDep.istanza.lavori << ";";
		file << adeDep.istanza.macchine << ";";
		file << nIndividui << ";";
		file << scalaElaborazione << ";";
		file << theta << ";";
		file << Fmax << ";";
		file << (normalizzazione ? "Si" : "No") << ";";
		file << seed << ";";
		file << durata.count() << ";";
		file << migliorIndividuo.score << ";";

		for (unsigned short i = 0; i < migliorIndividuo.dimensione; i++) {
			file << migliorIndividuo.individuo[i];
			if (i != migliorIndividuo.dimensione - 1) file << ",";
		}

		file << ";" << endl;

		file.close();
	}

	//cout << "Risultati salvati in: " << nomeReport << endl << endl;

	return 0;
}